

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

bool __thiscall libcellml::Generator::GeneratorImpl::modelHasNlas(GeneratorImpl *this)

{
  Type TVar1;
  
  TVar1 = AnalyserModel::type((this->mModel).
                              super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
  return (TVar1 - DAE & 0xfffffffd) == 0;
}

Assistant:

bool Generator::GeneratorImpl::modelHasNlas() const
{
    switch (mModel->type()) {
    case AnalyserModel::Type::NLA:
    case AnalyserModel::Type::DAE:
        return true;
    default:
        return false;
    }
}